

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

void BIT_flushBits(BIT_CStream_t *bitC)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  char *pcVar4;
  
  uVar1 = bitC->bitPos;
  puVar2 = (ulong *)bitC->ptr;
  uVar3 = bitC->bitContainer;
  *puVar2 = uVar3;
  pcVar4 = (char *)((ulong)(uVar1 >> 3) + (long)puVar2);
  if (bitC->endPtr < pcVar4) {
    pcVar4 = bitC->endPtr;
  }
  bitC->ptr = pcVar4;
  bitC->bitPos = uVar1 & 7;
  bitC->bitContainer = uVar3 >> ((byte)uVar1 & 0x38);
  return;
}

Assistant:

MEM_STATIC void BIT_flushBits(BIT_CStream_t* bitC)
{
    size_t const nbBytes = bitC->bitPos >> 3;
    assert(bitC->bitPos < sizeof(bitC->bitContainer) * 8);
    MEM_writeLEST(bitC->ptr, bitC->bitContainer);
    bitC->ptr += nbBytes;
    if (bitC->ptr > bitC->endPtr) bitC->ptr = bitC->endPtr;
    bitC->bitPos &= 7;
    bitC->bitContainer >>= nbBytes*8;
}